

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Object if_list_get_obj(Am_Value *v,bool only_if_one)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *in_value;
  byte in_DL;
  undefined7 in_register_00000031;
  undefined1 local_30 [8];
  Am_Value_List v_list;
  bool only_if_one_local;
  Am_Value *v_local;
  Am_Object *o;
  
  v_list.item._7_1_ = in_DL & 1;
  bVar1 = Am_Value_List::Test((Am_Value *)CONCAT71(in_register_00000031,only_if_one));
  if (bVar1) {
    Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
    Am_Value_List::operator=
              ((Am_Value_List *)local_30,(Am_Value *)CONCAT71(in_register_00000031,only_if_one));
    if (((v_list.item._7_1_ & 1) == 0) ||
       (uVar2 = Am_Value_List::Length((Am_Value_List *)local_30), uVar2 == 1)) {
      Am_Value_List::Start((Am_Value_List *)local_30);
      in_value = Am_Value_List::Get((Am_Value_List *)local_30);
      Am_Object::Am_Object((Am_Object *)v,in_value);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
    if (bVar1) {
      return (Am_Object)(Am_Object_Data *)v;
    }
  }
  Am_Object::Am_Object((Am_Object *)v,&Am_No_Object);
  return (Am_Object)(Am_Object_Data *)v;
}

Assistant:

Am_Object
if_list_get_obj(Am_Value v, bool only_if_one)
{
  if (Am_Value_List::Test(v)) {
    Am_Value_List v_list;
    v_list = v;
    if (!only_if_one || (v_list.Length() == 1)) {
      v_list.Start();
      Am_Object o = v_list.Get();
      return o;
    }
  }
  return Am_No_Object;
}